

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

bool __thiscall
glcts::ViewportArray::DepthRange::checkResults
          (DepthRange *this,texture *texture_0,texture *param_2,GLuint param_3)

{
  ostringstream *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  GLuint i;
  long lVar5;
  ulong uVar6;
  float fVar7;
  vector<float,_std::allocator<float>_> texture_data;
  GLfloat depth_data [32];
  undefined1 local_198 [384];
  
  texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize(&texture_data,0x20);
  Utils::texture::get(texture_0,0x1903,0x1406,
                      texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    fVar7 = (float)(int)lVar5 * 0.0625;
    depth_data[lVar5 * 2] = fVar7;
    depth_data[lVar5 * 2 + 1] = 1.0 - fVar7;
  }
  uVar4 = 0;
  while( true ) {
    uVar6 = uVar4;
    if (uVar6 == 0x10) goto LAB_00d8d07c;
    fVar7 = depth_data[uVar6 * 2];
    fVar1 = depth_data[uVar6 * 2 + 1];
    fVar2 = texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6];
    fVar3 = texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6 + 0x10];
    if ((fVar7 != fVar2) || (NAN(fVar7) || NAN(fVar2))) break;
    if ((fVar1 != fVar3) || (uVar4 = uVar6 + 1, NAN(fVar1) || NAN(fVar3))) break;
  }
  local_198._0_8_ = ((this->super_DrawTestBase).super_TestCaseBase.m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Invalid values at ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00," expected [");
  std::ostream::operator<<(this_00,fVar7);
  std::operator<<((ostream *)this_00,", ");
  std::ostream::operator<<(this_00,fVar1);
  std::operator<<((ostream *)this_00,"] got [");
  std::ostream::operator<<(this_00,fVar2);
  std::operator<<((ostream *)this_00,", ");
  std::ostream::operator<<(this_00,fVar3);
  std::operator<<((ostream *)this_00,"]");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
LAB_00d8d07c:
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texture_data.super__Vector_base<float,_std::allocator<float>_>);
  return 0xf < uVar6;
}

Assistant:

bool DepthRange::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */, GLuint /*draw_call_index */)
{
	static const GLfloat step = 1.0f / 16.0f;

	bool check_result = true;

	std::vector<GLfloat> texture_data;
	texture_data.resize(m_r32f_width * m_r32f_height);
	texture_0.get(GL_RED, GL_FLOAT, &texture_data[0]);

	GLfloat depth_data[16 * 2];

	for (GLuint i = 0; i < 16; ++i)
	{
		const GLfloat near = step * (GLfloat)i;

		depth_data[i * 2 + 0] = near;
		depth_data[i * 2 + 1] = 1.0f - near;
	}

	for (GLuint i = 0; i < 16; ++i)
	{
		const GLfloat expected_near = depth_data[i * 2 + 0];
		const GLfloat expected_far  = depth_data[i * 2 + 1];

		/* Bottom row should contain near values, top one should contain far values */
		const GLfloat near = texture_data[i];
		const GLfloat far  = texture_data[i + 16];

		if ((expected_near != near) || (expected_far != far))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid values at " << i << " expected ["
												<< expected_near << ", " << expected_far << "] got [" << near << ", "
												<< far << "]" << tcu::TestLog::EndMessage;

			check_result = false;
			break;
		}
	}

	return check_result;
}